

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O0

int __thiscall deqp::gles3::Functional::ShaderApiTests::init(ShaderApiTests *this,EVP_PKEY_CTX *ctx)

{
  string *__return_storage_ptr__;
  Context *pCVar1;
  ShaderType shaderType_00;
  int iVar2;
  TestCaseGroup *pTVar3;
  CreateShaderCase *pCVar4;
  TestNode *pTVar5;
  CompileShaderCase *pCVar6;
  char *pcVar7;
  ShaderSourceReplaceCase *this_00;
  char *pcVar8;
  ShaderSourceSplitCase *this_01;
  ProgramBinaryUniformResetCase *this_02;
  char *local_750;
  char *local_748;
  allocator<char> local_671;
  string local_670;
  allocator<char> local_649;
  string local_648;
  allocator<char> local_621;
  string local_620;
  allocator<char> local_5f9;
  string local_5f8;
  allocator<char> local_5d1;
  string local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  allocator<char> local_581;
  string local_580;
  allocator<char> local_559;
  string local_558;
  allocator<char> local_531;
  string local_530;
  allocator<char> local_509;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  TestCaseGroup *local_498;
  TestCaseGroup *binaryPersistenceGroup;
  TestCaseGroup *simpleCaseGroup;
  TestCaseGroup *programBinaryGroup;
  string local_478;
  allocator<char> local_451;
  string local_450;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  TestCaseGroup *local_2a0;
  TestCaseGroup *linkStatusGroup;
  allocator<char> local_271;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 local_1d0 [8];
  string caseDesc_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 local_150 [8];
  string caseName_1;
  deUint32 flags;
  bool randomNullTerm;
  int iStack_124;
  bool explicitLengths;
  ShaderType shaderType_1;
  int numSlices;
  int shaderTypeInt_1;
  int caseNdx;
  int stringLengthsInt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  string caseDesc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  string caseName;
  undefined1 local_60 [8];
  string shaderTypeName;
  ShaderType shaderType;
  int shaderTypeInt;
  TestCaseGroup *shaderSourceGroup;
  TestCaseGroup *compileLinkGroup;
  TestCaseGroup *createDeleteGroup;
  ShaderApiTests *this_local;
  
  pTVar3 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar3,(this->super_TestCaseGroup).m_context,"create_delete","glCreateShader() tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  pCVar4 = (CreateShaderCase *)operator_new(0xa0);
  CreateShaderCase::CreateShaderCase
            (pCVar4,(this->super_TestCaseGroup).m_context,"create_vertex_shader",
             "Create vertex shader object",SHADERTYPE_VERTEX);
  tcu::TestNode::addChild((TestNode *)pTVar3,(TestNode *)pCVar4);
  pCVar4 = (CreateShaderCase *)operator_new(0xa0);
  CreateShaderCase::CreateShaderCase
            (pCVar4,(this->super_TestCaseGroup).m_context,"create_fragment_shader",
             "Create fragment shader object",SHADERTYPE_FRAGMENT);
  tcu::TestNode::addChild((TestNode *)pTVar3,(TestNode *)pCVar4);
  pTVar5 = (TestNode *)operator_new(0xa8);
  DeleteShaderCase::DeleteShaderCase
            ((DeleteShaderCase *)pTVar5,(this->super_TestCaseGroup).m_context,
             "delete_vertex_fragment","Delete vertex shader and fragment shader");
  tcu::TestNode::addChild((TestNode *)pTVar3,pTVar5);
  pTVar3 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar3,(this->super_TestCaseGroup).m_context,"compile_link","Compile and link tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  pCVar6 = (CompileShaderCase *)operator_new(0xa0);
  CompileShaderCase::CompileShaderCase
            (pCVar6,(this->super_TestCaseGroup).m_context,"compile_vertex_shader",
             "Compile vertex shader",SHADERTYPE_VERTEX);
  tcu::TestNode::addChild((TestNode *)pTVar3,(TestNode *)pCVar6);
  pCVar6 = (CompileShaderCase *)operator_new(0xa0);
  CompileShaderCase::CompileShaderCase
            (pCVar6,(this->super_TestCaseGroup).m_context,"compile_fragment_shader",
             "Compile fragment shader",SHADERTYPE_FRAGMENT);
  tcu::TestNode::addChild((TestNode *)pTVar3,(TestNode *)pCVar6);
  pTVar5 = (TestNode *)operator_new(0xa8);
  LinkVertexFragmentCase::LinkVertexFragmentCase
            ((LinkVertexFragmentCase *)pTVar5,(this->super_TestCaseGroup).m_context,
             "link_vertex_fragment","Link vertex and fragment shaders");
  tcu::TestNode::addChild((TestNode *)pTVar3,pTVar5);
  pTVar3 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar3,(this->super_TestCaseGroup).m_context,"shader_source","glShaderSource() tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  for (shaderTypeName.field_2._12_4_ = 0; (int)shaderTypeName.field_2._12_4_ < 2;
      shaderTypeName.field_2._12_4_ = shaderTypeName.field_2._12_4_ + 1) {
    shaderTypeName.field_2._8_4_ = ZEXT14(shaderTypeName.field_2._12_4_ == 1);
    pcVar7 = glu::getShaderTypeName(shaderTypeName.field_2._8_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_60,pcVar7,(allocator<char> *)(caseName.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(caseName.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"replace_source_",
               (allocator<char> *)(caseDesc.field_2._M_local_buf + 0xf));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   &local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)(caseDesc.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stringLengthsInt,"Replace source code of ",
               (allocator<char> *)((long)&caseNdx + 3));
    std::operator+(&local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stringLengthsInt,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   &local_f0," shader.");
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&stringLengthsInt);
    std::allocator<char>::~allocator((allocator<char> *)((long)&caseNdx + 3));
    this_00 = (ShaderSourceReplaceCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar7 = (char *)std::__cxx11::string::c_str();
    pcVar8 = (char *)std::__cxx11::string::c_str();
    ShaderSourceReplaceCase::ShaderSourceReplaceCase
              (this_00,pCVar1,pcVar7,pcVar8,shaderTypeName.field_2._8_4_);
    tcu::TestNode::addChild((TestNode *)pTVar3,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string((string *)local_60);
  }
  for (shaderTypeInt_1 = 0; shaderTypeInt_1 < 3; shaderTypeInt_1 = shaderTypeInt_1 + 1) {
    for (numSlices = 1; numSlices < 4; numSlices = numSlices + 1) {
      for (shaderType_1 = SHADERTYPE_VERTEX; (int)shaderType_1 < 2;
          shaderType_1 = shaderType_1 + SHADERTYPE_FRAGMENT) {
        iStack_124 = 1 << ((byte)numSlices & 0x1f);
        shaderType_00 = (ShaderType)(shaderType_1 == SHADERTYPE_FRAGMENT);
        caseName_1.field_2._M_local_buf[0xf] = shaderTypeInt_1 != 0;
        caseName_1.field_2._M_local_buf[0xe] = shaderTypeInt_1 == 2;
        caseName_1.field_2._8_4_ =
             (uint)(byte)caseName_1.field_2._M_local_buf[0xf] +
             (uint)(byte)caseName_1.field_2._M_local_buf[0xe] * 2;
        __return_storage_ptr__ = (string *)((long)&caseDesc_1.field_2 + 8);
        de::toString<int>(__return_storage_ptr__,&stack0xfffffffffffffedc);
        std::operator+(&local_190,"split_source_",__return_storage_ptr__);
        if ((caseName_1.field_2._M_local_buf[0xe] & 1U) == 0) {
          if ((caseName_1.field_2._M_local_buf[0xf] & 1U) == 0) {
            local_750 = "_null_terminated";
          }
          else {
            local_750 = "_specify_lengths";
          }
          local_748 = local_750;
        }
        else {
          local_748 = "_random_negative_length";
        }
        std::operator+(&local_170,&local_190,local_748);
        pcVar7 = "_vertex";
        if (shaderType_00 == SHADERTYPE_FRAGMENT) {
          pcVar7 = "_fragment";
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_150,&local_170,pcVar7);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)(caseDesc_1.field_2._M_local_buf + 8));
        pcVar7 = "Vertex";
        if (shaderType_00 == SHADERTYPE_FRAGMENT) {
          pcVar7 = "Fragment";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,pcVar7,&local_271);
        std::operator+(&local_250,&local_270," shader source split into ");
        de::toString<int>((string *)&linkStatusGroup,&stack0xfffffffffffffedc);
        std::operator+(&local_230,&local_250,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &linkStatusGroup);
        std::operator+(&local_210,&local_230," pieces");
        pcVar7 = "";
        if ((caseName_1.field_2._M_local_buf[0xf] & 1U) != 0) {
          pcVar7 = ", using explicitly specified string lengths";
        }
        std::operator+(&local_1f0,&local_210,pcVar7);
        pcVar7 = "";
        if ((caseName_1.field_2._M_local_buf[0xe] & 1U) != 0) {
          pcVar7 = " with random negative length values";
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1d0,&local_1f0,pcVar7);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&linkStatusGroup);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_270);
        std::allocator<char>::~allocator(&local_271);
        this_01 = (ShaderSourceSplitCase *)operator_new(0xb8);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar7 = (char *)std::__cxx11::string::c_str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        ShaderSourceSplitCase::ShaderSourceSplitCase
                  (this_01,pCVar1,pcVar7,pcVar8,shaderType_00,iStack_124,caseName_1.field_2._8_4_);
        tcu::TestNode::addChild((TestNode *)pTVar3,(TestNode *)this_01);
        std::__cxx11::string::~string((string *)local_1d0);
        std::__cxx11::string::~string((string *)local_150);
      }
    }
  }
  pTVar3 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar3,(this->super_TestCaseGroup).m_context,"program_state",
             "Program state persistence tests");
  local_2a0 = pTVar3;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  pTVar3 = local_2a0;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"detach_shader",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"detach shader",&local_2e9);
  Functional::anon_unknown_0::
  addProgramStateCase<deqp::gles3::Functional::ProgramStateDetachShaderCase>
            (pTVar3,pCVar1,&local_2c0,&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  pTVar3 = local_2a0;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"reattach_shader",&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"reattach shader",&local_339);
  Functional::anon_unknown_0::
  addProgramStateCase<deqp::gles3::Functional::ProgramStateReattachShaderCase>
            (pTVar3,pCVar1,&local_310,&local_338);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  pTVar3 = local_2a0;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"delete_shader",&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"delete shader",&local_389);
  Functional::anon_unknown_0::
  addProgramStateCase<deqp::gles3::Functional::ProgramStateDeleteShaderCase>
            (pTVar3,pCVar1,&local_360,&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  pTVar3 = local_2a0;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b0,"replace_shader",&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,"replace shader object",&local_3d9);
  Functional::anon_unknown_0::
  addProgramStateCase<deqp::gles3::Functional::ProgramStateReplaceShaderCase>
            (pTVar3,pCVar1,&local_3b0,&local_3d8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  pTVar3 = local_2a0;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,"recompile_shader",&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,"recompile shader",&local_429);
  Functional::anon_unknown_0::
  addProgramStateCase<deqp::gles3::Functional::ProgramStateRecompileShaderCase>
            (pTVar3,pCVar1,&local_400,&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  pTVar3 = local_2a0;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"replace_source",&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,"replace shader source",
             (allocator<char> *)((long)&programBinaryGroup + 7));
  Functional::anon_unknown_0::
  addProgramStateCase<deqp::gles3::Functional::ProgramStateReplaceSourceCase>
            (pTVar3,pCVar1,&local_450,&local_478);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator((allocator<char> *)((long)&programBinaryGroup + 7));
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  pTVar3 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar3,(this->super_TestCaseGroup).m_context,"program_binary",
             "Program binary API tests");
  simpleCaseGroup = pTVar3;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  pTVar3 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar3,(this->super_TestCaseGroup).m_context,"simple","Simple API tests");
  binaryPersistenceGroup = pTVar3;
  tcu::TestNode::addChild((TestNode *)simpleCaseGroup,(TestNode *)pTVar3);
  pTVar3 = binaryPersistenceGroup;
  pTVar5 = (TestNode *)operator_new(0xa8);
  ProgramBinarySimpleCase::ProgramBinarySimpleCase
            ((ProgramBinarySimpleCase *)pTVar5,(this->super_TestCaseGroup).m_context,
             "get_program_binary_vertex_fragment","Get vertex and fragment shader program binary");
  tcu::TestNode::addChild((TestNode *)pTVar3,pTVar5);
  pTVar3 = binaryPersistenceGroup;
  this_02 = (ProgramBinaryUniformResetCase *)operator_new(0xb8);
  ProgramBinaryUniformResetCase::ProgramBinaryUniformResetCase
            (this_02,(this->super_TestCaseGroup).m_context,"uniform_reset_on_binary_load",
             "Verify uniform reset on successful load of program binary");
  tcu::TestNode::addChild((TestNode *)pTVar3,(TestNode *)this_02);
  pTVar3 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar3,(this->super_TestCaseGroup).m_context,"binary_persistence",
             "Program binary persistence tests");
  local_498 = pTVar3;
  tcu::TestNode::addChild((TestNode *)simpleCaseGroup,(TestNode *)pTVar3);
  pTVar3 = local_498;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b8,"detach_shader",&local_4b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e0,"detach shader",&local_4e1);
  Functional::anon_unknown_0::
  addProgramBinaryPersistenceCase<deqp::gles3::Functional::ProgramBinaryPersistenceDetachShaderCase>
            (pTVar3,pCVar1,&local_4b8,&local_4e0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  pTVar3 = local_498;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_508,"reattach_shader",&local_509);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"reattach shader",&local_531);
  Functional::anon_unknown_0::
  addProgramBinaryPersistenceCase<deqp::gles3::Functional::ProgramBinaryPersistenceReattachShaderCase>
            (pTVar3,pCVar1,&local_508,&local_530);
  std::__cxx11::string::~string((string *)&local_530);
  std::allocator<char>::~allocator(&local_531);
  std::__cxx11::string::~string((string *)&local_508);
  std::allocator<char>::~allocator(&local_509);
  pTVar3 = local_498;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"delete_shader",&local_559);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_580,"delete shader",&local_581);
  Functional::anon_unknown_0::
  addProgramBinaryPersistenceCase<deqp::gles3::Functional::ProgramBinaryPersistenceDeleteShaderCase>
            (pTVar3,pCVar1,&local_558,&local_580);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator(&local_581);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  pTVar3 = local_498;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a8,"replace_shader",&local_5a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d0,"replace shader object",&local_5d1);
  Functional::anon_unknown_0::
  addProgramBinaryPersistenceCase<deqp::gles3::Functional::ProgramBinaryPersistenceReplaceShaderCase>
            (pTVar3,pCVar1,&local_5a8,&local_5d0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  pTVar3 = local_498;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f8,"recompile_shader",&local_5f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_620,"recompile shader",&local_621);
  Functional::anon_unknown_0::
  addProgramBinaryPersistenceCase<deqp::gles3::Functional::ProgramBinaryPersistenceRecompileShaderCase>
            (pTVar3,pCVar1,&local_5f8,&local_620);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator(&local_621);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::allocator<char>::~allocator(&local_5f9);
  pTVar3 = local_498;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_648,"replace_source",&local_649);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_670,"replace shader source",&local_671);
  Functional::anon_unknown_0::
  addProgramBinaryPersistenceCase<deqp::gles3::Functional::ProgramBinaryPersistenceReplaceSourceCase>
            (pTVar3,pCVar1,&local_648,&local_670);
  std::__cxx11::string::~string((string *)&local_670);
  std::allocator<char>::~allocator(&local_671);
  std::__cxx11::string::~string((string *)&local_648);
  iVar2 = std::allocator<char>::~allocator(&local_649);
  return iVar2;
}

Assistant:

void ShaderApiTests::init (void)
{
	// create and delete shaders
	{
		TestCaseGroup* createDeleteGroup = new TestCaseGroup(m_context, "create_delete", "glCreateShader() tests");
		addChild(createDeleteGroup);

		createDeleteGroup->addChild(new CreateShaderCase(m_context,	"create_vertex_shader",		"Create vertex shader object",		glu::SHADERTYPE_VERTEX));
		createDeleteGroup->addChild(new CreateShaderCase(m_context,	"create_fragment_shader",	"Create fragment shader object",	glu::SHADERTYPE_FRAGMENT));

		createDeleteGroup->addChild(new DeleteShaderCase(m_context,	"delete_vertex_fragment",	"Delete vertex shader and fragment shader"));
	}

	// compile and link
	{
		TestCaseGroup* compileLinkGroup = new TestCaseGroup(m_context, "compile_link", "Compile and link tests");
		addChild(compileLinkGroup);

		compileLinkGroup->addChild(new CompileShaderCase(m_context,	"compile_vertex_shader",	"Compile vertex shader",	glu::SHADERTYPE_VERTEX));
		compileLinkGroup->addChild(new CompileShaderCase(m_context,	"compile_fragment_shader",	"Compile fragment shader",	glu::SHADERTYPE_FRAGMENT));

		compileLinkGroup->addChild(new LinkVertexFragmentCase(m_context,	"link_vertex_fragment",	"Link vertex and fragment shaders"));
	}

	// shader source
	{
		TestCaseGroup* shaderSourceGroup = new TestCaseGroup(m_context, "shader_source", "glShaderSource() tests");
		addChild(shaderSourceGroup);

		for (int shaderTypeInt = 0; shaderTypeInt < 2; shaderTypeInt++)
		{
			const glu::ShaderType	shaderType		= (shaderTypeInt == 1) ? glu::SHADERTYPE_FRAGMENT : glu::SHADERTYPE_VERTEX;
			const std::string		shaderTypeName	= getShaderTypeName(shaderType);

			const std::string		caseName		= std::string("replace_source_") + shaderTypeName;
			const std::string		caseDesc		= std::string("Replace source code of ") + shaderTypeName + " shader.";

			shaderSourceGroup->addChild(new ShaderSourceReplaceCase(m_context, caseName.c_str(), caseDesc.c_str(), shaderType));
		}

		for (int stringLengthsInt	= 0; stringLengthsInt < 3; stringLengthsInt++)
		for (int caseNdx = 1; caseNdx <= 3; caseNdx++)
		for (int shaderTypeInt = 0; shaderTypeInt < 2; shaderTypeInt++)
		{
			const int				numSlices		= 1 << caseNdx;
			const glu::ShaderType	shaderType		= (shaderTypeInt == 1) ? glu::SHADERTYPE_FRAGMENT : glu::SHADERTYPE_VERTEX;

			const bool				explicitLengths	= (stringLengthsInt != 0);
			const bool				randomNullTerm	= (stringLengthsInt == 2);

			const deUint32			flags			= (explicitLengths	? CASE_EXPLICIT_SOURCE_LENGTHS	: 0)
													| (randomNullTerm	? CASE_RANDOM_NULL_TERMINATED	: 0);

			const std::string		caseName		= "split_source_"
													+ de::toString(numSlices)
													+ (randomNullTerm ? "_random_negative_length" : (explicitLengths ? "_specify_lengths" : "_null_terminated"))
													+ ((shaderType == glu::SHADERTYPE_FRAGMENT) ? "_fragment" : "_vertex");

			const std::string		caseDesc		= std::string((shaderType == glu::SHADERTYPE_FRAGMENT) ? "Fragment" : "Vertex")
													+ " shader source split into "
													+ de::toString(numSlices)
													+ " pieces"
													+ (explicitLengths ? ", using explicitly specified string lengths" : "")
													+ (randomNullTerm ? " with random negative length values" : "");

			shaderSourceGroup->addChild(new ShaderSourceSplitCase(m_context, caseName.c_str(), caseDesc.c_str(), shaderType, numSlices, flags));
		}
	}

	// link status and infolog
	{
		TestCaseGroup* linkStatusGroup = new TestCaseGroup(m_context, "program_state", "Program state persistence tests");
		addChild(linkStatusGroup);

		addProgramStateCase<ProgramStateDetachShaderCase>		(linkStatusGroup,	m_context,	"detach_shader",	"detach shader");
		addProgramStateCase<ProgramStateReattachShaderCase>		(linkStatusGroup,	m_context,	"reattach_shader",	"reattach shader");
		addProgramStateCase<ProgramStateDeleteShaderCase>		(linkStatusGroup,	m_context,	"delete_shader",	"delete shader");
		addProgramStateCase<ProgramStateReplaceShaderCase>		(linkStatusGroup,	m_context,	"replace_shader",	"replace shader object");
		addProgramStateCase<ProgramStateRecompileShaderCase>	(linkStatusGroup,	m_context,	"recompile_shader",	"recompile shader");
		addProgramStateCase<ProgramStateReplaceSourceCase>		(linkStatusGroup,	m_context,	"replace_source",	"replace shader source");
	}

	// program binary
	{
		TestCaseGroup* programBinaryGroup = new TestCaseGroup(m_context, "program_binary", "Program binary API tests");
		addChild(programBinaryGroup);

		{
			TestCaseGroup* simpleCaseGroup = new TestCaseGroup(m_context, "simple", "Simple API tests");
			programBinaryGroup->addChild(simpleCaseGroup);

			simpleCaseGroup->addChild(new ProgramBinarySimpleCase		(m_context,	"get_program_binary_vertex_fragment",	"Get vertex and fragment shader program binary"));
			simpleCaseGroup->addChild(new ProgramBinaryUniformResetCase	(m_context,	"uniform_reset_on_binary_load",			"Verify uniform reset on successful load of program binary"));
		}

		{
			TestCaseGroup* binaryPersistenceGroup = new TestCaseGroup(m_context, "binary_persistence", "Program binary persistence tests");
			programBinaryGroup->addChild(binaryPersistenceGroup);

			addProgramBinaryPersistenceCase<ProgramBinaryPersistenceDetachShaderCase>		(binaryPersistenceGroup,	m_context,	"detach_shader",	"detach shader");
			addProgramBinaryPersistenceCase<ProgramBinaryPersistenceReattachShaderCase>		(binaryPersistenceGroup,	m_context,	"reattach_shader",	"reattach shader");
			addProgramBinaryPersistenceCase<ProgramBinaryPersistenceDeleteShaderCase>		(binaryPersistenceGroup,	m_context,	"delete_shader",	"delete shader");
			addProgramBinaryPersistenceCase<ProgramBinaryPersistenceReplaceShaderCase>		(binaryPersistenceGroup,	m_context,	"replace_shader",	"replace shader object");
			addProgramBinaryPersistenceCase<ProgramBinaryPersistenceRecompileShaderCase>	(binaryPersistenceGroup,	m_context,	"recompile_shader",	"recompile shader");
			addProgramBinaryPersistenceCase<ProgramBinaryPersistenceReplaceSourceCase>		(binaryPersistenceGroup,	m_context,	"replace_source",	"replace shader source");
		}
	}
}